

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O1

void __thiscall
proto2_unittest::TestParsingMerge_RepeatedGroup::~TestParsingMerge_RepeatedGroup
          (TestParsingMerge_RepeatedGroup *this)

{
  InternalMetadata *this_00;
  TestAllTypes *self;
  ulong uVar1;
  LogMessageFatal local_20;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadata::
    DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(this_00);
  }
  uVar1 = this_00->ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    self = (this->field_0)._impl_.repeated_group_all_types_;
    if (self != (TestAllTypes *)0x0) {
      TestAllTypes::SharedDtor((MessageLite *)self);
      operator_delete(self,0x340);
      return;
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest.pb.cc"
             ,0xa3b9,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

TestParsingMerge_RepeatedGroup::~TestParsingMerge_RepeatedGroup() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestParsingMerge.RepeatedGroup)
  SharedDtor(*this);
}